

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O2

zip_source_t *
zip_source_winzip_aes_decode
          (zip_t *za,zip_source_t *src,zip_uint16_t encryption_method,int flags,char *password)

{
  int iVar1;
  winzip_aes *ctx;
  char *pcVar2;
  zip_source_t *pzVar3;
  ulong uVar4;
  zip_stat_t st;
  
  if (((src == (zip_source_t *)0x0) || ((ushort)(encryption_method - 0x104) < 0xfffd)) ||
     (password == (char *)0x0)) {
    iVar1 = 0x12;
  }
  else if ((flags & 1U) == 0) {
    iVar1 = zip_source_stat(src,&st);
    if (iVar1 != 0) {
      zip_error_set_from_source(&za->error,src);
      return (zip_source_t *)0x0;
    }
    uVar4 = 0x14;
    if (encryption_method != 0x101) {
      uVar4 = (ulong)(encryption_method != 0x102) * 4 + 0x18;
    }
    if ((((byte)st.valid & 8) == 0) || (st.comp_size < uVar4)) {
      iVar1 = 0x1c;
    }
    else {
      ctx = (winzip_aes *)malloc(0x38);
      if (ctx != (winzip_aes *)0x0) {
        pcVar2 = strdup(password);
        ctx->password = pcVar2;
        if (pcVar2 == (char *)0x0) {
          zip_error_set(&za->error,0xe,0);
          free(ctx);
          return (zip_source_t *)0x0;
        }
        ctx->encryption_method = encryption_method;
        ctx->aes_ctx = (zip_winzip_aes_t *)0x0;
        zip_error_init(&ctx->error);
        ctx->data_length = st.comp_size - uVar4;
        pzVar3 = zip_source_layered(za,src,winzip_aes_decrypt,ctx);
        if (pzVar3 == (zip_source_t *)0x0) {
          winzip_aes_free(ctx);
          return (zip_source_t *)0x0;
        }
        return pzVar3;
      }
      iVar1 = 0xe;
    }
  }
  else {
    iVar1 = 0x18;
  }
  zip_error_set(&za->error,iVar1,0);
  return (zip_source_t *)0x0;
}

Assistant:

zip_source_t *
zip_source_winzip_aes_decode(zip_t *za, zip_source_t *src, zip_uint16_t encryption_method, int flags, const char *password) {
    zip_source_t *s2;
    zip_stat_t st;
    zip_uint64_t aux_length;
    struct winzip_aes *ctx;

    if ((encryption_method != ZIP_EM_AES_128 && encryption_method != ZIP_EM_AES_192 && encryption_method != ZIP_EM_AES_256) || password == NULL || src == NULL) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    if (flags & ZIP_CODEC_ENCODE) {
        zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
        return NULL;
    }

    if (zip_source_stat(src, &st) != 0) {
        zip_error_set_from_source(&za->error, src);
        return NULL;
    }

    aux_length = WINZIP_AES_PASSWORD_VERIFY_LENGTH + SALT_LENGTH(encryption_method) + HMAC_LENGTH;

    if ((st.valid & ZIP_STAT_COMP_SIZE) == 0 || st.comp_size < aux_length) {
        zip_error_set(&za->error, ZIP_ER_OPNOTSUPP, 0);
        return NULL;
    }

    if ((ctx = winzip_aes_new(encryption_method, password, &za->error)) == NULL) {
        return NULL;
    }

    ctx->data_length = st.comp_size - aux_length;

    if ((s2 = zip_source_layered(za, src, winzip_aes_decrypt, ctx)) == NULL) {
        winzip_aes_free(ctx);
        return NULL;
    }

    return s2;
}